

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O2

void __thiscall
dlib::image_display::on_mouse_up
          (image_display *this,unsigned_long btn,unsigned_long state,long x,long y)

{
  _Head_base<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_false> _Var1;
  byte bVar2;
  rectangle *prVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  point c1;
  rectangle new_rect;
  point local_e8;
  rectangle local_d8;
  point local_b8;
  overlay_rect local_a8;
  
  scrollable_region::on_mouse_up(&this->super_scrollable_region,btn,state,x,y);
  if ((state & 8) == 0) {
    if (this->holding_shift_key == true) {
      this->holding_shift_key = false;
      base_window::invalidate_rectangle
                (&((this->super_scrollable_region).super_drawable.parent)->super_base_window,
                 &(this->super_scrollable_region).super_drawable.rect);
    }
  }
  else {
    this->holding_shift_key = true;
  }
  bVar2 = this->drawing_rect;
  if ((((btn != 1 || (state & 8) == 0) || (bool)bVar2 != true) ||
      ((this->super_scrollable_region).super_drawable.hidden != false)) ||
     ((this->super_scrollable_region).super_drawable.enabled != true)) goto LAB_0029587a;
  prVar3 = scrollable_region::total_rect(&this->super_scrollable_region);
  local_e8.
  super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>.
  data.data[0] = x - prVar3->l;
  local_e8.
  super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>.
  data.data[1] = y - prVar3->t;
  lVar5 = (this->rect_anchor).
          super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
          .data.data[0] - prVar3->l;
  lVar4 = (this->rect_anchor).
          super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
          .data.data[1] - prVar3->t;
  local_b8.
  super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>.
  data.data[0] = lVar5;
  local_b8.
  super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>.
  data.data[1] = lVar4;
  if (this->zoom_in_scale == 1) {
    if (this->zoom_out_scale != 1) {
      dVar7 = (double)this->zoom_out_scale;
      dVar8 = (double)local_e8.
                      super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                      .data.data[1];
      dVar6 = floor((double)local_e8.
                            super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                            .data.data[0] * dVar7 + 0.5);
      local_e8.
      super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
      .data.data[0] = (long)dVar6;
      dVar6 = floor(dVar8 * dVar7 + 0.5);
      dVar8 = (double)lVar5 * dVar7;
      dVar7 = (double)lVar4 * dVar7;
      goto LAB_00295789;
    }
  }
  else {
    dVar7 = (double)this->zoom_in_scale;
    dVar8 = (double)local_e8.
                    super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                    .data.data[1];
    dVar6 = floor((double)local_e8.
                          super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                          .data.data[0] / dVar7 + 0.5);
    local_e8.
    super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[0] = (long)dVar6;
    dVar6 = floor(dVar8 / dVar7 + 0.5);
    dVar8 = (double)lVar5 / dVar7;
    dVar7 = (double)lVar4 / dVar7;
LAB_00295789:
    local_e8.
    super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[1] = (long)dVar6;
    dVar6 = floor(dVar8 + 0.5);
    local_b8.
    super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[0] = (long)dVar6;
    dVar6 = floor(dVar7 + 0.5);
    local_b8.
    super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[1] = (long)dVar6;
  }
  rectangle::rectangle(&local_d8,&local_e8,&local_b8);
  if (this->zoom_in_scale != 1) {
    local_d8.r = local_d8.r + -1;
    local_d8.b = local_d8.b + -1;
  }
  if (((local_d8.b - local_d8.t != -1) && (local_d8.t <= local_d8.b)) &&
     ((local_d8.l <= local_d8.r && (local_d8.r - local_d8.l != -1)))) {
    overlay_rect::overlay_rect<dlib::rgb_alpha_pixel>
              (&local_a8,&local_d8,this->default_rect_color,&this->default_rect_label);
    add_overlay(this,&local_a8);
    overlay_rect::~overlay_rect(&local_a8);
    _Var1._M_head_impl =
         (this->event_handler).data._M_t.
         super___uniq_ptr_impl<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
         .super__Head_base<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_false>.
         _M_head_impl;
    if (_Var1._M_head_impl != (Tbase<void_()> *)0x0) {
      (*(_Var1._M_head_impl)->_vptr_Tbase[2])();
    }
  }
  bVar2 = this->drawing_rect;
LAB_0029587a:
  if ((bVar2 & 1) != 0) {
    this->drawing_rect = false;
    base_window::invalidate_rectangle
              (&((this->super_scrollable_region).super_drawable.parent)->super_base_window,
               &(this->super_scrollable_region).super_drawable.rect);
  }
  if (this->moving_overlay == true) {
    this->moving_overlay = false;
  }
  return;
}

Assistant:

void image_display::
    on_mouse_up (
        unsigned long btn,
        unsigned long state,
        long x,
        long y
    )
    {
        scrollable_region::on_mouse_up(btn,state,x,y);

        if (state&base_window::SHIFT)
        {
            holding_shift_key = true;
        }
        else if (holding_shift_key)
        {
            holding_shift_key = false;
            parent.invalidate_rectangle(rect);
        }

        if (drawing_rect && btn == base_window::LEFT && (state&base_window::SHIFT) &&
            !hidden && enabled)
        {
            const point origin(total_rect().tl_corner());
            point c1 = point(x,y) - origin;
            point c2 = rect_anchor - origin;

            if (zoom_in_scale != 1)
            {
                c1 = c1/(double)zoom_in_scale;
                c2 = c2/(double)zoom_in_scale;
            }
            else if (zoom_out_scale != 1)
            {
                c1 = c1*(double)zoom_out_scale;
                c2 = c2*(double)zoom_out_scale;
            }

            rectangle new_rect(c1,c2);
            if (zoom_in_scale != 1)
            {
                // When we are zoomed in we adjust the rectangles a little so they
                // are drown surrounding the pixels inside the rect.  This adjustment
                // is necessary to make this code consistent with this goal.
                new_rect.right() -= 1;
                new_rect.bottom() -= 1;
            }


            if (new_rect.width() > 0 && new_rect.height() > 0)
            {
                add_overlay(overlay_rect(new_rect, default_rect_color, default_rect_label));

                if (event_handler.is_set())
                    event_handler();
            }
        }

        if (drawing_rect)
        {
            drawing_rect = false;
            parent.invalidate_rectangle(rect);
        }
        if (moving_overlay)
        {
            moving_overlay = false;
        }
    }